

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,sunrealtype droptol,int sparsetype)

{
  double dVar1;
  long *plVar2;
  long M;
  long N;
  void *pvVar3;
  long lVar4;
  SUNMatrix p_Var5;
  long lVar6;
  sunindextype NNZ;
  long lVar7;
  long lVar8;
  long lVar9;
  
  plVar2 = (long *)Ad->content;
  M = *plVar2;
  N = plVar2[1];
  if (N < 1) {
    NNZ = 0;
  }
  else {
    lVar6 = 0;
    NNZ = 0;
    do {
      if (0 < M) {
        lVar7 = 0;
        do {
          NNZ = NNZ + (ulong)(droptol <
                             ABS(*(double *)(*(long *)(plVar2[4] + lVar6 * 8) + lVar7 * 8)));
          lVar7 = lVar7 + 1;
        } while (M != lVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != N);
  }
  p_Var5 = SUNSparseMatrix(M,N,NNZ,sparsetype,Ad->sunctx);
  if (sparsetype == 0) {
    pvVar3 = p_Var5->content;
    lVar6 = *(long *)((long)pvVar3 + 0x38);
    if (N < 1) {
      lVar7 = 0;
    }
    else {
      lVar8 = 0;
      lVar7 = 0;
      do {
        *(long *)(lVar6 + lVar8 * 8) = lVar7;
        if (0 < M) {
          lVar4 = *(long *)(*(long *)((long)Ad->content + 0x20) + lVar8 * 8);
          lVar9 = 0;
          do {
            dVar1 = *(double *)(lVar4 + lVar9 * 8);
            if (droptol < ABS(dVar1)) {
              *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar7 * 8) = lVar9;
              *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar7 * 8) = dVar1;
              lVar7 = lVar7 + 1;
            }
            lVar9 = lVar9 + 1;
          } while (M != lVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != N);
    }
    *(long *)(lVar6 + N * 8) = lVar7;
  }
  else {
    pvVar3 = p_Var5->content;
    lVar6 = *(long *)((long)pvVar3 + 0x38);
    if (M < 1) {
      lVar7 = 0;
    }
    else {
      lVar8 = 0;
      lVar7 = 0;
      do {
        *(long *)(lVar6 + lVar8 * 8) = lVar7;
        if (0 < N) {
          lVar4 = *(long *)((long)Ad->content + 0x20);
          lVar9 = 0;
          do {
            dVar1 = *(double *)(*(long *)(lVar4 + lVar9 * 8) + lVar8 * 8);
            if (droptol < ABS(dVar1)) {
              *(long *)(*(long *)((long)pvVar3 + 0x30) + lVar7 * 8) = lVar9;
              *(double *)(*(long *)((long)pvVar3 + 0x20) + lVar7 * 8) = dVar1;
              lVar7 = lVar7 + 1;
            }
            lVar9 = lVar9 + 1;
          } while (N != lVar9);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != M);
    }
    *(long *)(lVar6 + M * 8) = lVar7;
  }
  return p_Var5;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, sunrealtype droptol,
                                   int sparsetype)
{
  SUNFunctionBegin(Ad->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ad) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = 0; i < M; i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = NULL;
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ad->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = 0; i < M; i++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = 0; j < N; j++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}